

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_xref(jit_State *J,IRIns *refa,IRIns *xa,IRIns *xb)

{
  IRIns *pIVar1;
  bool local_8a;
  bool local_89;
  IRIns local_88;
  IRIns local_80;
  ptrdiff_t szb;
  ptrdiff_t sza;
  IRIns *irk_1;
  IRIns *irk;
  IRIns *baseb;
  IRIns *basea;
  IRIns *refb;
  ptrdiff_t ofsb;
  ptrdiff_t ofsa;
  IRIns *xb_local;
  IRIns *xa_local;
  IRIns *refa_local;
  jit_State *J_local;
  
  ofsb = 0;
  refb = (IRIns *)0x0;
  irk = (J->cur).ir + (xb->field_0).op1;
  if ((refa == irk) && ((((xa->field_1).t.irt ^ (xb->field_1).t.irt) & 0x1f) == 0)) {
    J_local._4_4_ = ALIAS_MUST;
  }
  else {
    baseb = refa;
    if (((refa->field_1).o == ')') && ((refa->field_0).op2 < 0x8000)) {
      pIVar1 = (J->cur).ir + (refa->field_0).op2;
      baseb = (J->cur).ir + (refa->field_0).op1;
      if ((pIVar1->field_1).o == '\x1d') {
        local_80 = pIVar1[1];
      }
      else {
        local_80 = (IRIns)(long)pIVar1->i;
      }
      ofsb = (ptrdiff_t)local_80;
    }
    if (((irk->field_1).o == ')') && ((irk->field_0).op2 < 0x8000)) {
      pIVar1 = (J->cur).ir + (irk->field_0).op2;
      irk = (J->cur).ir + (irk->field_0).op1;
      if ((pIVar1->field_1).o == '\x1d') {
        local_88 = pIVar1[1];
      }
      else {
        local_88 = (IRIns)(long)pIVar1->i;
      }
      refb = (IRIns *)local_88;
    }
    if (((baseb->field_1).o == '\x19') && ((irk->field_1).o == '\x19')) {
      refb = (IRIns *)(((long)irk[1] - (long)baseb[1]) + (long)refb);
      irk = baseb;
    }
    if (baseb == irk) {
      if ((IRIns *)ofsb == refb) {
        if ((ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                   [(xa->field_1).t.irt] ==
            (ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                   [(xb->field_1).t.irt]) {
          local_89 = true;
          if (((xa->field_1).t.irt & 0x1f) != 0xe) {
            local_89 = ((xa->field_1).t.irt & 0x1f) == 0xd;
          }
          local_8a = true;
          if (((xb->field_1).t.irt & 0x1f) != 0xe) {
            local_8a = ((xb->field_1).t.irt & 0x1f) == 0xd;
          }
          if (local_89 == local_8a) {
            return ALIAS_MUST;
          }
        }
      }
      else if (((long)(ofsb + (ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                                     [(xa->field_1).t.irt]) <= (long)refb) ||
              ((long)((long)refb +
                     (ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                            [(xb->field_1).t.irt]) <= ofsb)) {
        return ALIAS_NO;
      }
      J_local._4_4_ = ALIAS_MAY;
    }
    else if (((((xa->field_1).t.irt ^ (xb->field_1).t.irt) & 0x1f) == 0) ||
            ((((xa->field_1).t.irt & 0x1f) - 0xf < 8 &&
             (((xa->field_1).t.irt - 0xf ^ (xb->field_1).t.irt - 0xf) == 1)))) {
      J_local._4_4_ = aa_cnew(J,baseb,irk);
    }
    else {
      J_local._4_4_ = ALIAS_NO;
    }
  }
  return J_local._4_4_;
}

Assistant:

static AliasRet aa_xref(jit_State *J, IRIns *refa, IRIns *xa, IRIns *xb)
{
  ptrdiff_t ofsa = 0, ofsb = 0;
  IRIns *refb = IR(xb->op1);
  IRIns *basea = refa, *baseb = refb;
  if (refa == refb && irt_sametype(xa->t, xb->t))
    return ALIAS_MUST;  /* Shortcut for same refs with identical type. */
  /* Offset-based disambiguation. */
  if (refa->o == IR_ADD && irref_isk(refa->op2)) {
    IRIns *irk = IR(refa->op2);
    basea = IR(refa->op1);
    ofsa = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  if (refb->o == IR_ADD && irref_isk(refb->op2)) {
    IRIns *irk = IR(refb->op2);
    baseb = IR(refb->op1);
    ofsb = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  /* Treat constified pointers like base vs. base+offset. */
  if (basea->o == IR_KPTR && baseb->o == IR_KPTR) {
    ofsb += (char *)ir_kptr(baseb) - (char *)ir_kptr(basea);
    baseb = basea;
  }
  /* This implements (very) strict aliasing rules.
  ** Different types do NOT alias, except for differences in signedness.
  ** Type punning through unions is allowed (but forces a reload).
  */
  if (basea == baseb) {
    ptrdiff_t sza = irt_size(xa->t), szb = irt_size(xb->t);
    if (ofsa == ofsb) {
      if (sza == szb && irt_isfp(xa->t) == irt_isfp(xb->t))
	return ALIAS_MUST;  /* Same-sized, same-kind. May need to convert. */
    } else if (ofsa + sza <= ofsb || ofsb + szb <= ofsa) {
      return ALIAS_NO;  /* Non-overlapping base+-o1 vs. base+-o2. */
    }
    /* NYI: extract, extend or reinterpret bits (int <-> fp). */
    return ALIAS_MAY;  /* Overlapping or type punning: force reload. */
  }
  if (!irt_sametype(xa->t, xb->t) &&
      !(irt_typerange(xa->t, IRT_I8, IRT_U64) &&
	((xa->t.irt - IRT_I8) ^ (xb->t.irt - IRT_I8)) == 1))
    return ALIAS_NO;
  /* NYI: structural disambiguation. */
  return aa_cnew(J, basea, baseb);  /* Try to disambiguate allocations. */
}